

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_long_type_param_tests.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  UnitTestSource *pUVar6;
  Variable *pVVar7;
  undefined1 in_CL;
  int iVar8;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  string xml_type_param2;
  string xml_type_param1;
  string type_param2;
  string type_param1;
  unsigned_long *in_stack_fffffffffffffac8;
  allocator<char> local_529;
  AssertionResult local_528;
  AssertionHelper local_500;
  string local_4d0;
  string local_4b0;
  int local_48c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  DefaultXmlGeneratorListener *local_3c8 [2];
  undefined1 local_3b8 [16];
  DefaultXmlGeneratorListener *local_3a8;
  DefaultXmlGeneratorListener local_398;
  undefined1 local_348 [128];
  ios_base local_2c8 [264];
  int local_1c0;
  undefined1 local_1b8 [392];
  
  local_48c = argc;
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar6);
  iutest::TestEnv::ParseCommandLine<char>(&local_48c,argv);
  iutest::TestEnv::LoadFlagFile();
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
  iutest::detail::
  GetTypeNameProxy<iutest::Types<int,float,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None>>
  ::GetTypeName_abi_cxx11_();
  iutest::detail::
  GetTypeNameProxy<TestType<TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone>>
  ::GetTypeName_abi_cxx11_();
  local_3a8 = &local_398;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_398.m_output_path._M_string_length,
             (undefined1 *)
             (local_398.m_output_path._M_string_length +
             local_398.m_output_path.field_2._M_allocated_capacity));
  iutest::DefaultXmlGeneratorListener::EscapeXml_abi_cxx11_
            (&local_4b0,local_3a8,(char *)0x1,(bool)in_CL);
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,
                    (long)local_398.super_EmptyTestEventListener.super_TestEventListener.
                          _vptr_TestEventListener + 1);
  }
  local_3c8[0] = (DefaultXmlGeneratorListener *)local_3b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3c8,local_398.m_output_path_format._M_string_length,
             (undefined1 *)
             (local_398.m_output_path_format._M_string_length +
             local_398.m_output_path_format.field_2._M_allocated_capacity));
  iutest::DefaultXmlGeneratorListener::EscapeXml_abi_cxx11_
            (&local_4d0,local_3c8[0],(char *)0x1,(bool)in_CL);
  if (local_3c8[0] != (DefaultXmlGeneratorListener *)local_3b8) {
    operator_delete(local_3c8[0],local_3b8._0_8_ + 1);
  }
  pVVar7 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,(pVVar7->m_output_option).m_value._M_dataplus._M_p,
             (allocator<char> *)local_1b8);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             *)local_348,"xml:test.xml");
  if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
    operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
  }
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iVar4 = iutest::UnitTestSource::Run(pUVar6);
  iVar8 = 1;
  if (iVar4 == 0) {
    iVar4 = 0;
    local_348._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1271c9,0);
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&local_528,(internal *)"::std::string::npos",
               "FileIO::s_io.find(\"iutest::detail::None\")",(char *)&std::__cxx11::string::npos,
               (unsigned_long *)local_348,in_R9);
    bVar2 = local_528.m_result;
    if (local_528.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3e8,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,&local_3e8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
      local_1c0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_500,local_528.m_message._M_dataplus._M_p,&local_529);
      local_500.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
      ;
      local_500.m_part_result.super_iuCodeMessage.m_line = 0x5d;
      local_500.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_500,(Fixed *)local_348,false);
      iVar4 = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_500.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_500.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
      std::ios_base::~ios_base(local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    paVar1 = &local_528.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_528.m_message._M_dataplus._M_p,
                      CONCAT71(local_528.m_message.field_2._M_allocated_capacity._1_7_,
                               local_528.m_message.field_2._M_local_buf[0]) + 1);
    }
    iVar8 = iVar4;
    if (bVar2 != false) {
      local_348._0_8_ =
           std::__cxx11::string::find
                     ((char *)&FileIO::s_io_abi_cxx11_,(ulong)local_4b0._M_dataplus._M_p,0);
      pcVar3 = std::__cxx11::string::npos;
      if (std::__cxx11::string::npos == (pointer)local_348._0_8_) {
        in_R9 = (unsigned_long *)local_348;
        iutest::internal::CmpHelperOpFailure<unsigned_long,unsigned_long>
                  (&local_528,(internal *)"::std::string::npos","FileIO::s_io.find(xml_type_param1)"
                   ,"!=",(char *)&std::__cxx11::string::npos,in_R9,in_stack_fffffffffffffac8);
        bVar2 = true;
        if ((local_528.m_result & 1U) == 0) {
          memset((iu_global_format_stringstream *)local_1b8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_1b8);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_408,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                     FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                     FileIO::s_io_abi_cxx11_._M_string_length);
          iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,&local_408);
          iutest::detail::iuStreamMessage::iuStreamMessage
                    ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
          local_1c0 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_500,local_528.m_message._M_dataplus._M_p,&local_529);
          local_500.m_part_result.super_iuCodeMessage.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
          ;
          local_500.m_part_result.super_iuCodeMessage.m_line = 0x5e;
          local_500.m_part_result.super_iuCodeMessage._44_4_ = 2;
          iutest::AssertionHelper::OnFixed(&local_500,(Fixed *)local_348,false);
          iVar4 = local_1c0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
              &local_500.m_part_result.super_iuCodeMessage.m_message.field_2) {
            operator_delete(local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                            local_500.m_part_result.super_iuCodeMessage.m_message.field_2.
                            _M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
          std::ios_base::~ios_base(local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
          bVar2 = false;
        }
      }
      else {
        local_528.m_message._M_string_length = 0;
        local_528.m_message.field_2._M_local_buf[0] = '\0';
        local_528.m_result = true;
        bVar2 = true;
        local_528.m_message._M_dataplus._M_p = (pointer)paVar1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_528.m_message._M_dataplus._M_p,
                        CONCAT71(local_528.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_528.m_message.field_2._M_local_buf[0]) + 1);
      }
      iVar8 = iVar4;
      if (bVar2) {
        local_348._0_8_ =
             std::__cxx11::string::find
                       ((char *)&FileIO::s_io_abi_cxx11_,(ulong)local_4d0._M_dataplus._M_p,0);
        if (pcVar3 == (pointer)local_348._0_8_) {
          in_R9 = (unsigned_long *)local_348;
          iutest::internal::CmpHelperOpFailure<unsigned_long,unsigned_long>
                    (&local_528,(internal *)"::std::string::npos",
                     "FileIO::s_io.find(xml_type_param2)","!=",(char *)&std::__cxx11::string::npos,
                     in_R9,in_stack_fffffffffffffac8);
          bVar2 = true;
          if ((local_528.m_result & 1U) == 0) {
            memset((iu_global_format_stringstream *)local_1b8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1b8);
            local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_428,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                       FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                       FileIO::s_io_abi_cxx11_._M_string_length);
            iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,&local_428);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
            local_1c0 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_500,local_528.m_message._M_dataplus._M_p,&local_529);
            local_500.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
            ;
            local_500.m_part_result.super_iuCodeMessage.m_line = 0x5f;
            local_500.m_part_result.super_iuCodeMessage._44_4_ = 2;
            iutest::AssertionHelper::OnFixed(&local_500,(Fixed *)local_348,false);
            iVar4 = local_1c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                &local_500.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete(local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ,local_500.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
            std::ios_base::~ios_base(local_2c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
            bVar2 = false;
          }
        }
        else {
          local_528.m_message._M_string_length = 0;
          local_528.m_message.field_2._M_local_buf[0] = '\0';
          local_528.m_result = true;
          bVar2 = true;
          local_528.m_message._M_dataplus._M_p = (pointer)paVar1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_528.m_message._M_dataplus._M_p,
                          CONCAT71(local_528.m_message.field_2._M_allocated_capacity._1_7_,
                                   local_528.m_message.field_2._M_local_buf[0]) + 1);
        }
        iVar8 = iVar4;
        if (bVar2) {
          FileIO::s_io_abi_cxx11_._M_string_length = 0;
          *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
          pVVar7 = iutest::TestEnv::get_vars();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,(pVVar7->m_output_option).m_value._M_dataplus._M_p,
                     (allocator<char> *)local_1b8);
          iutest::TestEnv::
          OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
          ::operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                       *)local_348,"junit:test.xml");
          if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
            operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
          }
          pUVar6 = iutest::UnitTestSource::GetInstance();
          iVar5 = iutest::UnitTestSource::Run(pUVar6);
          iVar8 = 1;
          if (iVar5 == 0) {
            local_348._0_8_ =
                 std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1271c9,0);
            iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      (&local_528,(internal *)"::std::string::npos",
                       "FileIO::s_io.find(\"iutest::detail::None\")",
                       (char *)&std::__cxx11::string::npos,(unsigned_long *)local_348,in_R9);
            bVar2 = local_528.m_result;
            if (local_528.m_result == false) {
              memset((iu_global_format_stringstream *)local_1b8,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_1b8);
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_448,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                         FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                         FileIO::s_io_abi_cxx11_._M_string_length);
              iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,&local_448);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
              local_1c0 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_500,local_528.m_message._M_dataplus._M_p,&local_529);
              local_500.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
              ;
              local_500.m_part_result.super_iuCodeMessage.m_line = 0x68;
              local_500.m_part_result.super_iuCodeMessage._44_4_ = 2;
              iutest::AssertionHelper::OnFixed(&local_500,(Fixed *)local_348,false);
              iVar4 = local_1c0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                  &local_500.m_part_result.super_iuCodeMessage.m_message.field_2) {
                operator_delete(local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p,local_500.m_part_result.super_iuCodeMessage.m_message.field_2.
                                     _M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
              std::ios_base::~ios_base(local_2c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                local_448.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528.m_message._M_dataplus._M_p != paVar1) {
              operator_delete(local_528.m_message._M_dataplus._M_p,
                              CONCAT71(local_528.m_message.field_2._M_allocated_capacity._1_7_,
                                       local_528.m_message.field_2._M_local_buf[0]) + 1);
            }
            iVar8 = iVar4;
            if (bVar2 != false) {
              local_348._0_8_ =
                   std::__cxx11::string::find
                             ((char *)&FileIO::s_io_abi_cxx11_,(ulong)local_4b0._M_dataplus._M_p,0);
              if (pcVar3 == (pointer)local_348._0_8_) {
                iutest::internal::CmpHelperOpFailure<unsigned_long,unsigned_long>
                          (&local_528,(internal *)"::std::string::npos",
                           "FileIO::s_io.find(xml_type_param1)","!=",
                           (char *)&std::__cxx11::string::npos,(unsigned_long *)local_348,
                           in_stack_fffffffffffffac8);
                bVar2 = true;
                if ((local_528.m_result & 1U) == 0) {
                  memset((iu_global_format_stringstream *)local_1b8,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            ((iu_global_format_stringstream *)local_1b8);
                  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_468,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                             FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                             FileIO::s_io_abi_cxx11_._M_string_length);
                  iutest::detail::iuStreamMessage::operator<<
                            ((iuStreamMessage *)local_1b8,&local_468);
                  iutest::detail::iuStreamMessage::iuStreamMessage
                            ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
                  local_1c0 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_500,local_528.m_message._M_dataplus._M_p,&local_529);
                  local_500.m_part_result.super_iuCodeMessage.m_file =
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                  ;
                  local_500.m_part_result.super_iuCodeMessage.m_line = 0x69;
                  local_500.m_part_result.super_iuCodeMessage._44_4_ = 2;
                  iutest::AssertionHelper::OnFixed(&local_500,(Fixed *)local_348,false);
                  iVar4 = local_1c0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                      &local_500.m_part_result.super_iuCodeMessage.m_message.field_2) {
                    operator_delete(local_500.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p,
                                    local_500.m_part_result.super_iuCodeMessage.m_message.field_2.
                                    _M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
                  std::ios_base::~ios_base(local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._M_dataplus._M_p != &local_468.field_2) {
                    operator_delete(local_468._M_dataplus._M_p,
                                    local_468.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
                  bVar2 = false;
                }
              }
              else {
                local_528.m_message._M_string_length = 0;
                local_528.m_message.field_2._M_local_buf[0] = '\0';
                local_528.m_result = true;
                bVar2 = true;
                local_528.m_message._M_dataplus._M_p = (pointer)paVar1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528.m_message._M_dataplus._M_p != paVar1) {
                operator_delete(local_528.m_message._M_dataplus._M_p,
                                CONCAT71(local_528.m_message.field_2._M_allocated_capacity._1_7_,
                                         local_528.m_message.field_2._M_local_buf[0]) + 1);
              }
              iVar8 = iVar4;
              if (bVar2) {
                local_348._0_8_ =
                     std::__cxx11::string::find
                               ((char *)&FileIO::s_io_abi_cxx11_,(ulong)local_4d0._M_dataplus._M_p,0
                               );
                if (pcVar3 == (pointer)local_348._0_8_) {
                  iutest::internal::CmpHelperOpFailure<unsigned_long,unsigned_long>
                            (&local_528,(internal *)"::std::string::npos",
                             "FileIO::s_io.find(xml_type_param2)","!=",
                             (char *)&std::__cxx11::string::npos,(unsigned_long *)local_348,
                             in_stack_fffffffffffffac8);
                  bVar2 = true;
                  if ((local_528.m_result & 1U) == 0) {
                    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_1b8);
                    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_488,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                               FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                               FileIO::s_io_abi_cxx11_._M_string_length);
                    iutest::detail::iuStreamMessage::operator<<
                              ((iuStreamMessage *)local_1b8,&local_488);
                    iutest::detail::iuStreamMessage::iuStreamMessage
                              ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
                    local_1c0 = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_500,local_528.m_message._M_dataplus._M_p,&local_529)
                    ;
                    local_500.m_part_result.super_iuCodeMessage.m_file =
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                    ;
                    local_500.m_part_result.super_iuCodeMessage.m_line = 0x6a;
                    local_500.m_part_result.super_iuCodeMessage._44_4_ = 2;
                    iutest::AssertionHelper::OnFixed(&local_500,(Fixed *)local_348,false);
                    iVar4 = local_1c0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_500.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                        &local_500.m_part_result.super_iuCodeMessage.m_message.field_2) {
                      operator_delete(local_500.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p,
                                      local_500.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_allocated_capacity + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
                    std::ios_base::~ios_base(local_2c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_488._M_dataplus._M_p != &local_488.field_2) {
                      operator_delete(local_488._M_dataplus._M_p,
                                      local_488.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
                    bVar2 = false;
                  }
                }
                else {
                  local_528.m_message._M_string_length = 0;
                  local_528.m_message.field_2._M_local_buf[0] = '\0';
                  local_528.m_result = true;
                  bVar2 = true;
                  local_528.m_message._M_dataplus._M_p = (pointer)paVar1;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528.m_message._M_dataplus._M_p != paVar1) {
                  operator_delete(local_528.m_message._M_dataplus._M_p,
                                  CONCAT71(local_528.m_message.field_2._M_allocated_capacity._1_7_,
                                           local_528.m_message.field_2._M_local_buf[0]) + 1);
                }
                iVar8 = iVar4;
                if (bVar2) {
                  FileIO::s_io_abi_cxx11_._M_string_length = 0;
                  *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
                  puts("*** Successful ***");
                  iVar8 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_398.m_output_path_format._M_string_length !=
      (undefined1 *)((long)&local_398.m_output_path_format.field_2 + 8)) {
    operator_delete((void *)local_398.m_output_path_format._M_string_length,
                    local_398.m_output_path_format.field_2._8_8_ + 1);
  }
  if ((undefined1 *)local_398.m_output_path._M_string_length !=
      (undefined1 *)((long)&local_398.m_output_path.field_2 + 8)) {
    operator_delete((void *)local_398.m_output_path._M_string_length,
                    local_398.m_output_path.field_2._8_8_ + 1);
  }
  return iVar8;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
#if OUTPUT_XML_TEST
    IUTEST_INIT(&argc, argv);

    const ::std::string type_param1 = iutest::detail::GetTypeNameProxy< ::iutest::Types<int, float> >::GetTypeName();
    const ::std::string type_param2 = iutest::detail::GetTypeNameProxy< AliasTestType >::GetTypeName();
    const ::std::string xml_type_param1 = HackXmlGeneratorListener::EscapeXmlAttribute(type_param1);
    const ::std::string xml_type_param2 = HackXmlGeneratorListener::EscapeXmlAttribute(type_param2);

    ::iutest::IUTEST_FLAG(output) = "xml:test.xml";
    {
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret != 0 ) return 1;
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("iutest::detail::None")) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param1)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param2)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        FileIO::s_io.clear();
    }

    ::iutest::IUTEST_FLAG(output) = "junit:test.xml";
    {
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret != 0 ) return 1;
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("iutest::detail::None")) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param1)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param2)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        FileIO::s_io.clear();
    }
    printf("*** Successful ***\n");
#else
    (void)argc;
    (void)argv;
    printf("*** OUTPUT_XML_TEST=0 ***\n");
#endif
    return 0;
}